

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::number::impl::NumberStringBuilder::codePointAt(NumberStringBuilder *this,int32_t index)

{
  char16_t *pcVar1;
  uint local_18;
  uint16_t __c2;
  UChar32 cp;
  int32_t index_local;
  NumberStringBuilder *this_local;
  
  pcVar1 = getCharPtr(this);
  local_18 = (uint)(ushort)pcVar1[(long)this->fZero + (long)index];
  if ((local_18 & 0xfffff800) == 0xd800) {
    if ((pcVar1[(long)this->fZero + (long)index] & 0x400U) == 0) {
      if (index + 1 != this->fLength) {
        pcVar1 = getCharPtr(this);
        if ((pcVar1[(long)this->fZero + (long)(index + 1)] & 0xfc00U) == 0xdc00) {
          local_18 = local_18 * 0x400 + (uint)(ushort)pcVar1[(long)this->fZero + (long)(index + 1)]
                     + 0xfca02400;
        }
      }
    }
    else if (0 < index) {
      pcVar1 = getCharPtr(this);
      if ((pcVar1[(long)this->fZero + (long)(index + -1)] & 0xfc00U) == 0xd800) {
        local_18 = (uint)(ushort)pcVar1[(long)this->fZero + (long)(index + -1)] * 0x400 + local_18 +
                   0xfca02400;
      }
    }
  }
  return local_18;
}

Assistant:

UChar32 NumberStringBuilder::codePointAt(int32_t index) const {
    UChar32 cp;
    U16_GET(getCharPtr() + fZero, 0, index, fLength, cp);
    return cp;
}